

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

void __thiscall license::Project::~Project(Project *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_templates_folder)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_templates_folder).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_project_folder)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_project_folder).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Project::~Project() {}